

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.cpp
# Opt level: O0

TLVReader * __thiscall
ASDCP::MXF::TLVReader::ReadObject(TLVReader *this,MDDEntry *Entry,IArchive *Object)

{
  bool bVar1;
  ulong uVar2;
  long *in_RCX;
  IArchive *Object_local;
  MDDEntry *Entry_local;
  TLVReader *this_local;
  
  if (in_RCX == (long *)0x0) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
  }
  else {
    bVar1 = FindTL((TLVReader *)Entry,(MDDEntry *)Object);
    if ((bVar1) && (*(uint *)(Entry->ul + 0xc) < *(uint *)(Entry->ul + 8))) {
      uVar2 = (**(code **)(*in_RCX + 0x28))(in_RCX,Entry);
      if ((uVar2 & 1) == 0) {
        Kumu::Result_t::operator()((int *)this,Kumu::RESULT_FALSE);
      }
      else {
        Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
      }
    }
    else {
      Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_FALSE);
    }
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::TLVReader::ReadObject(const MDDEntry& Entry, Kumu::IArchive* Object)
{
  ASDCP_TEST_NULL(Object);

  if ( FindTL(Entry) )
    {
      if ( m_size < m_capacity ) // don't try to unarchive an empty item
	{
	  // TODO: carry on if uachive fails
	  return Object->Unarchive(this) ? RESULT_OK : RESULT_FALSE(__LINE__, __FILE__);
	}
    }

  return RESULT_FALSE;
}